

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveFinder.cpp
# Opt level: O1

string * __thiscall
senjo::MoveFinder::KnightMove_abi_cxx11_
          (string *__return_storage_ptr__,MoveFinder *this,char *p,Square *from,Square *to)

{
  char type;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type *psVar3;
  char *local_50;
  string local_48;
  int iVar1;
  
  local_50 = p;
  if (this->ctm == White) {
    iVar1 = toupper(0x4e);
    type = (char)iVar1;
  }
  else {
    iVar1 = tolower(0x4e);
    type = (char)iVar1;
  }
  PieceMove_abi_cxx11_(&local_48,this,&local_50,type,from,to);
  if ((local_48._M_string_length != 0) && (*local_50 != '\0')) {
    iVar1 = isspace((int)*local_50);
    if (iVar1 == 0) {
      paVar2 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar2;
      psVar3 = &__return_storage_ptr__->_M_string_length;
      goto LAB_00146dd3;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  paVar2 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == paVar2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_48.field_2._M_allocated_capacity
    ;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_48.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_48._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_48.field_2._M_allocated_capacity
    ;
  }
  psVar3 = &local_48._M_string_length;
  __return_storage_ptr__->_M_string_length = local_48._M_string_length;
  local_48._M_dataplus._M_p = (pointer)paVar2;
LAB_00146dd3:
  *psVar3 = 0;
  paVar2->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MoveFinder::KnightMove(const char* p, Square from, Square to) const
{
  std::string move = PieceMove(p, Friend('N'), from, to);
  if (move.size() && *p && !isspace(*p)) {
    return std::string();
  }
  return move;
}